

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

PolymorphicEmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitLoop(WasmBytecodeGenerator *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  RegSlot RVar4;
  BlockInfo *blockInfo;
  RegisterSpace *this_00;
  WasmBinaryReader *pWVar5;
  Types type;
  long lVar6;
  PolymorphicEmitInfo PVar7;
  RegSlot local_68 [2];
  RegSlot curRegs [5];
  BlockInfo *local_48;
  BlockInfo *implicitBlockInfo;
  uint local_38;
  uint local_34;
  
  uVar2 = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  uVar3 = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  implicitBlockInfo._4_4_ = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar5 == (WasmBinaryReader *)0x0) {
    pWVar5 = (this->m_module->m_reader).ptr;
  }
  implicitBlockInfo._0_4_ = uVar2;
  blockInfo = PushLabel(this,(pWVar5->super_WasmReaderBase).m_currentNode.field_1.block,uVar2,true,
                        true);
  local_48 = blockInfo;
  for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
    bVar1 = WAsmJs::TypedRegisterAllocator::IsTypeExcluded
                      (&this->mTypedRegisterAllocator,(Types)lVar6);
    RVar4 = 0;
    if (!bVar1) {
      this_00 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                          (&this->mTypedRegisterAllocator,(Types)lVar6);
      RVar4 = WAsmJs::RegisterSpace::PeekNextTmpRegister(this_00);
    }
    local_68[lVar6] = RVar4;
  }
  local_34 = uVar3;
  local_38 = (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1d])
                       (this->m_writer,(ulong)uVar3,local_68);
  JsUtil::Stack<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Pop
            (&this->m_blockInfos);
  uVar2 = implicitBlockInfo._4_4_;
  pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar5 == (WasmBinaryReader *)0x0) {
    pWVar5 = (this->m_module->m_reader).ptr;
  }
  PushLabel(this,(pWVar5->super_WasmReaderBase).m_currentNode.field_1.block,implicitBlockInfo._4_4_,
            false,true);
  EmitBlockCommon(this,blockInfo,(bool *)0x0);
  PopLabel(this,uVar2);
  uVar3 = (uint)implicitBlockInfo;
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x19])
            (this->m_writer,(ulong)(uint)implicitBlockInfo,0x25);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)uVar2);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x19])(this->m_writer,(ulong)local_34,0x25);
  JsUtil::
  List<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
            (&(this->m_blockInfos).list,&local_48);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)uVar3);
  PVar7 = PopLabel(this,uVar3);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1e])(this->m_writer,(ulong)local_38);
  PVar7._4_4_ = 0;
  return PVar7;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EmitLoop()
{
    Js::ByteCodeLabel loopTailLabel = m_writer->DefineLabel();
    Js::ByteCodeLabel loopHeadLabel = m_writer->DefineLabel();
    Js::ByteCodeLabel loopLandingPadLabel = m_writer->DefineLabel();

    // Push possibly yielding loop label before capturing all the yielding registers
    BlockInfo* implicitBlockInfo = PushLabel(GetReader()->m_currentNode.block, loopTailLabel);

    // Save the first tmp (per type) of this loop to discern a yield outside the loop in jitloopbody scenario
    Js::RegSlot curRegs[WAsmJs::LIMIT];
    for (WAsmJs::Types type = WAsmJs::Types(0); type != WAsmJs::LIMIT; type = WAsmJs::Types(type + 1))
    {
        uint32 minYield = 0;
        if (!mTypedRegisterAllocator.IsTypeExcluded(type))
        {
            CompileAssert(sizeof(minYield) == sizeof(Js::RegSlot));
            minYield = static_cast<uint32>(mTypedRegisterAllocator.GetRegisterSpace(type)->PeekNextTmpRegister());
        }
        curRegs[type] = minYield;
    }
    uint32 loopId = m_writer->WasmLoopStart(loopHeadLabel, curRegs);

    // Internally we create a block for loop to exit, but semantically, they don't exist so pop it
    m_blockInfos.Pop();

    // We don't want nested block to jump directly to the loop header
    // instead, jump to the landing pad and let it jump back to the loop header
    PushLabel(GetReader()->m_currentNode.block, loopLandingPadLabel, false);
    EmitBlockCommon(implicitBlockInfo);
    PopLabel(loopLandingPadLabel);

    // By default we don't loop, jump over the landing pad
    m_writer->AsmBr(loopTailLabel);
    m_writer->MarkAsmJsLabel(loopLandingPadLabel);
    m_writer->AsmBr(loopHeadLabel);

    // Put the implicit block back on the stack and yield the last expression to it
    m_blockInfos.Push(implicitBlockInfo);
    m_writer->MarkAsmJsLabel(loopTailLabel);
    // Pop the implicit block to resolve the yield correctly
    PolymorphicEmitInfo loopInfo = PopLabel(loopTailLabel);
    m_writer->ExitLoop(loopId);

    return loopInfo;
}